

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImpl::~QNetworkReplyImpl(QNetworkReplyImpl *this)

{
  bool bVar1;
  QAbstractNetworkCache *pQVar2;
  QNetworkReply *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImplPrivate *d;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffffc8;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffffd0;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_0049b0b8;
  d_func((QNetworkReplyImpl *)0x1ec718);
  bVar1 = QNetworkReplyImplPrivate::isCachingEnabled(in_stack_ffffffffffffffd0);
  if (bVar1) {
    pQVar2 = QNetworkReplyImplPrivate::networkCache(in_stack_ffffffffffffffc8);
    QNetworkReply::url(in_RDI);
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_10);
    QUrl::~QUrl(&local_10);
  }
  QNetworkReply::~QNetworkReply((QNetworkReply *)0x1ec76f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkReplyImpl::~QNetworkReplyImpl()
{
    Q_D(QNetworkReplyImpl);

    // This code removes the data from the cache if it was prematurely aborted.
    // See QNetworkReplyImplPrivate::completeCacheSave(), we disable caching there after the cache
    // save had been properly finished. So if it is still enabled it means we got deleted/aborted.
    if (d->isCachingEnabled())
        d->networkCache()->remove(url());
}